

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::presolveColSingletons(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int iVar1;
  int *piVar2;
  pointer puVar3;
  Result RVar4;
  pointer piVar5;
  int *piVar6;
  pointer piVar7;
  Result unaff_EBP;
  int *piVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  
  piVar5 = (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar10 = (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish == piVar5;
  if (!bVar10) {
    lVar9 = 0;
    do {
      bVar11 = false;
      if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[piVar5[lVar9]] == '\0') {
        RVar4 = colPresolve(this,postsolve_stack,piVar5[lVar9]);
        bVar11 = RVar4 != kOk;
        if (bVar11) {
          unaff_EBP = RVar4;
        }
      }
      if (bVar11) break;
      lVar9 = lVar9 + 1;
      piVar5 = (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar10 = lVar9 == (long)(this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
    } while (!bVar10);
  }
  if (!bVar10) {
    return unaff_EBP;
  }
  piVar6 = (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)piVar2 - (long)piVar6 >> 4;
  piVar8 = piVar6;
  if (0 < lVar9) {
    puVar3 = (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar8 = (int *)(((long)piVar2 - (long)piVar6 & 0xfffffffffffffff0U) + (long)piVar6);
    piVar5 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = lVar9 + 1;
    piVar6 = piVar6 + 2;
    do {
      if ((puVar3[piVar6[-2]] != '\0') || (1 < piVar5[piVar6[-2]])) {
        piVar6 = piVar6 + -2;
        goto LAB_0031956f;
      }
      if ((puVar3[piVar6[-1]] != '\0') || (1 < piVar5[piVar6[-1]])) {
        piVar6 = piVar6 + -1;
        goto LAB_0031956f;
      }
      if ((puVar3[*piVar6] != '\0') || (1 < piVar5[*piVar6])) goto LAB_0031956f;
      if ((puVar3[piVar6[1]] != '\0') || (1 < piVar5[piVar6[1]])) {
        piVar6 = piVar6 + 1;
        goto LAB_0031956f;
      }
      lVar9 = lVar9 + -1;
      piVar6 = piVar6 + 4;
    } while (1 < lVar9);
  }
  lVar9 = (long)piVar2 - (long)piVar8 >> 2;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      piVar6 = piVar2;
      if (((lVar9 != 3) ||
          (piVar6 = piVar8,
          (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[*piVar8] != '\0')) ||
         (1 < (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar8])) goto LAB_0031956f;
      piVar8 = piVar8 + 1;
    }
    piVar6 = piVar8;
    if (((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start[*piVar8] != '\0') ||
       (1 < (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[*piVar8])) goto LAB_0031956f;
    piVar8 = piVar8 + 1;
  }
  piVar6 = piVar8;
  if (((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[*piVar8] == '\0') &&
     ((this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[*piVar8] < 2)) {
    piVar6 = piVar2;
  }
LAB_0031956f:
  if ((piVar6 != piVar2) && (piVar8 = piVar6 + 1, piVar8 != piVar2)) {
    puVar3 = (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar5 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar1 = *piVar8;
      if ((puVar3[iVar1] == '\0') && (piVar5[iVar1] < 2)) {
        *piVar6 = iVar1;
        piVar6 = piVar6 + 1;
      }
      piVar8 = piVar8 + 1;
    } while (piVar8 != piVar2);
  }
  if ((piVar6 != piVar2) &&
     (piVar5 = (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
     piVar7 = (pointer)((long)piVar6 + ((long)piVar5 - (long)piVar2)), piVar5 != piVar7)) {
    (this->singletonColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar7;
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::presolveColSingletons(
    HighsPostsolveStack& postsolve_stack) {
  for (size_t i = 0; i != singletonColumns.size(); ++i) {
    HighsInt col = singletonColumns[i];
    if (colDeleted[col]) continue;
    HPRESOLVE_CHECKED_CALL(colPresolve(postsolve_stack, col));
  }
  singletonColumns.erase(
      std::remove_if(
          singletonColumns.begin(), singletonColumns.end(),
          [&](HighsInt col) { return colDeleted[col] || colsize[col] > 1; }),
      singletonColumns.end());

  return Result::kOk;
}